

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::invalid_request_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,invalid_request_alert *this)

{
  uint uVar1;
  undefined8 uVar2;
  char *local_228;
  char *local_220;
  allocator<char> local_1d5 [13];
  string local_1c8;
  char local_1a8 [8];
  char ret [400];
  invalid_request_alert *this_local;
  
  ret._392_8_ = this;
  peer_alert::message_abi_cxx11_(&local_1c8,&this->super_peer_alert);
  uVar2 = std::__cxx11::string::c_str();
  uVar1 = libtorrent::aux::strong_typedef::operator_cast_to_int
                    ((strong_typedef *)&(this->super_peer_alert).field_0x9c);
  if ((this->withheld & 1U) == 0) {
    if ((this->we_have & 1U) == 0) {
      local_228 = ": we don\'t have piece";
    }
    else {
      local_228 = "";
      if (((this->peer_interested ^ 0xffU) & 1) != 0) {
        local_228 = ": peer is not interested";
      }
    }
    local_220 = local_228;
  }
  else {
    local_220 = ": super seeding withheld piece";
  }
  snprintf(local_1a8,400,"%s peer sent an invalid piece request (piece: %d start: %d len: %d)%s",
           uVar2,(ulong)uVar1,(ulong)*(uint *)&this->field_0xa0,*(undefined4 *)&this->field_0xa4,
           local_220);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_1a8,local_1d5);
  std::allocator<char>::~allocator(local_1d5);
  return __return_storage_ptr__;
}

Assistant:

std::string invalid_request_alert::message() const
	{
		char ret[400];
		std::snprintf(ret, sizeof(ret), "%s peer sent an invalid piece request "
			"(piece: %d start: %d len: %d)%s"
			, peer_alert::message().c_str()
			, static_cast<int>(request.piece)
			, request.start
			, request.length
			, withheld ? ": super seeding withheld piece"
			: !we_have ? ": we don't have piece"
			: !peer_interested ? ": peer is not interested"
			: "");
		return ret;
	}